

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrapTCPService.h
# Opt level: O0

bool __thiscall
brynet::net::WrapTcpService::
addSession<std::function<void(brynet::net::AddSessionOption::Options&)>,std::function<void(brynet::net::AddSessionOption::Options&)>>
          (WrapTcpService *this,PTR *socket,
          function<void_(brynet::net::AddSessionOption::Options_&)> *args,
          function<void_(brynet::net::AddSessionOption::Options_&)> *args_1)

{
  initializer_list<std::function<void_(brynet::net::AddSessionOption::Options_&)>_> __l;
  byte bVar1;
  _Any_data *local_d8;
  allocator<std::function<void_(brynet::net::AddSessionOption::Options_&)>_> local_b5 [13];
  _Any_data *local_a8;
  _Any_data local_a0 [2];
  function<void_(brynet::net::AddSessionOption::Options_&)> local_80;
  _Any_data local_60;
  vector<std::function<void_(brynet::net::AddSessionOption::Options_&)>,_std::allocator<std::function<void_(brynet::net::AddSessionOption::Options_&)>_>_>
  local_50;
  unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter> local_38;
  function<void_(brynet::net::AddSessionOption::Options_&)> *local_30;
  function<void_(brynet::net::AddSessionOption::Options_&)> *args_local_1;
  function<void_(brynet::net::AddSessionOption::Options_&)> *args_local;
  PTR *socket_local;
  WrapTcpService *this_local;
  
  local_30 = args_1;
  args_local_1 = args;
  args_local = (function<void_(brynet::net::AddSessionOption::Options_&)> *)socket;
  socket_local = (PTR *)this;
  std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>::unique_ptr
            (&local_38,socket);
  local_a8 = local_a0;
  std::function<void_(brynet::net::AddSessionOption::Options_&)>::function
            ((function<void_(brynet::net::AddSessionOption::Options_&)> *)local_a8,args_local_1);
  local_a8 = (_Any_data *)&local_80;
  std::function<void_(brynet::net::AddSessionOption::Options_&)>::function
            ((function<void_(brynet::net::AddSessionOption::Options_&)> *)local_a8,local_30);
  local_60._M_unused._M_object = local_a0;
  local_60._8_8_ = 2;
  std::allocator<std::function<void_(brynet::net::AddSessionOption::Options_&)>_>::allocator
            (local_b5);
  __l._M_len = local_60._8_8_;
  __l._M_array = (iterator)local_60._M_unused._0_8_;
  std::
  vector<std::function<void_(brynet::net::AddSessionOption::Options_&)>,_std::allocator<std::function<void_(brynet::net::AddSessionOption::Options_&)>_>_>
  ::vector(&local_50,__l,local_b5);
  bVar1 = brynet::net::WrapTcpService::_addSession(this,&local_38,&local_50);
  this_local._7_1_ = bVar1 & 1;
  std::
  vector<std::function<void_(brynet::net::AddSessionOption::Options_&)>,_std::allocator<std::function<void_(brynet::net::AddSessionOption::Options_&)>_>_>
  ::~vector(&local_50);
  std::allocator<std::function<void_(brynet::net::AddSessionOption::Options_&)>_>::~allocator
            (local_b5);
  local_d8 = &local_60;
  do {
    local_d8 = local_d8 + -2;
    std::function<void_(brynet::net::AddSessionOption::Options_&)>::~function
              ((function<void_(brynet::net::AddSessionOption::Options_&)> *)local_d8);
  } while (local_d8 != local_a0);
  std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>::~unique_ptr
            (&local_38);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool                        addSession(TcpSocket::PTR socket, const Args& ... args)
            {
                return _addSession(std::move(socket), { args... });
            }